

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O3

void internalJSONNode::deleteInternal(internalJSONNode *ptr)

{
  if (ptr != (internalJSONNode *)0x0) {
    ~internalJSONNode(ptr);
  }
  operator_delete(ptr);
  return;
}

Assistant:

void internalJSONNode::deleteInternal(internalJSONNode * ptr) json_nothrow {
	#ifdef JSON_MEMORY_POOL /*-> JSON_MEMORY_POOL */
		ptr -> ~internalJSONNode();
		json_internal_mempool.deallocate((void*)ptr);
	#elif defined(JSON_MEMORY_CALLBACKS) /*<- else JSON_MEMORY_CALLBACKS */
		ptr -> ~internalJSONNode();
		libjson_free<internalJSONNode>(ptr);
	#else /*<- else */
		delete ptr;
	#endif /*<- */
}